

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

bool __thiscall
Fossilize::FeatureFilter::Impl::raytracing_pipeline_is_supported
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *info)

{
  VkPipelineDynamicStateCreateInfo *pVVar1;
  VkPipelineShaderStageCreateInfo *pVVar2;
  VkRayTracingPipelineInterfaceCreateInfoKHR *pVVar3;
  bool bVar4;
  int *piVar5;
  const_iterator cVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  key_type local_70;
  key_type local_50;
  
  for (piVar5 = (int *)info->pNext; piVar5 != (int *)0x0; piVar5 = *(int **)(piVar5 + 2)) {
    if (*piVar5 == 0x3ba1f5f5) goto LAB_00111272;
  }
  piVar5 = (int *)0x0;
LAB_00111272:
  if (piVar5 == (int *)0x0) {
    uVar9 = (ulong)info->flags;
  }
  else {
    uVar9 = *(ulong *)(piVar5 + 4);
  }
  if ((uVar9 & 0xffffffff96ec0738) == 0) {
    if (this->null_device != false) {
      return true;
    }
    uVar8 = (uint)uVar9;
    if (((uVar9 & 0x3000) == 0) ||
       ((this->features).ray_tracing_pipeline.rayTraversalPrimitiveCulling != 0)) {
      if ((uVar8 >> 0xb & 1) == 0) {
        bVar4 = false;
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"VK_KHR_pipeline_library","");
        cVar6 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)this,&local_50);
        bVar4 = cVar6.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur == (__node_type *)0x0;
      }
      if (((uVar8 >> 0xb & 1) != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((((!bVar4) &&
           (((uVar8 >> 0x1d & 1) == 0 || ((this->features).descriptor_buffer.descriptorBuffer != 0))
           )) && (((uVar8 >> 0x14 & 1) == 0 ||
                  ((this->features).ray_tracing_motion_blur_nv.rayTracingMotionBlur != 0)))) &&
         (((uVar8 >> 0x18 & 1) == 0 || ((this->features).opacity_micromap.micromap != 0)))) {
        if ((uVar9 & 0x48000000) != 0 &&
            (this->features).pipeline_protected_access.pipelineProtectedAccess == 0) {
          return false;
        }
        if ((this->features).ray_tracing_pipeline.rayTracingPipeline == 0) {
          return false;
        }
        if (info->maxPipelineRayRecursionDepth <=
            (this->props).ray_tracing_pipeline.maxRayRecursionDepth) {
          pVVar1 = info->pDynamicState;
          if (pVVar1 != (VkPipelineDynamicStateCreateInfo *)0x0) {
            if (pVVar1->dynamicStateCount != 0) {
              lVar7 = 0;
              do {
                if (pVVar1->pDynamicStates[lVar7] !=
                    VK_DYNAMIC_STATE_RAY_TRACING_PIPELINE_STACK_SIZE_KHR) {
                  return false;
                }
                lVar7 = lVar7 + 1;
              } while (pVVar1->dynamicStateCount != (uint32_t)lVar7);
            }
            bVar4 = pnext_chain_is_supported(this,pVVar1->pNext);
            if (!bVar4) {
              return false;
            }
          }
          if ((info->pLibraryInfo == (VkPipelineLibraryCreateInfoKHR *)0x0) &&
             (info->pLibraryInterface == (VkRayTracingPipelineInterfaceCreateInfoKHR *)0x0)) {
            bVar4 = false;
            bVar10 = false;
          }
          else {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,"VK_KHR_pipeline_library","");
            cVar6 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)this,&local_70);
            bVar10 = cVar6.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur == (__node_type *)0x0;
            bVar4 = true;
          }
          if ((bVar4) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2)) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if (!bVar10) {
            if (info->stageCount != 0) {
              lVar7 = 0;
              uVar9 = 0;
              do {
                pVVar2 = info->pStages;
                bVar4 = subgroup_size_control_is_supported
                                  (this,(VkPipelineShaderStageCreateInfo *)
                                        ((long)&pVVar2->sType + lVar7));
                if (!bVar4) {
                  return false;
                }
                bVar4 = pnext_chain_is_supported(this,*(void **)((long)&pVVar2->pNext + lVar7));
                if (!bVar4) {
                  return false;
                }
                uVar9 = uVar9 + 1;
                lVar7 = lVar7 + 0x30;
              } while (uVar9 < info->stageCount);
            }
            pVVar3 = info->pLibraryInterface;
            if (((pVVar3 == (VkRayTracingPipelineInterfaceCreateInfoKHR *)0x0) ||
                ((pVVar3->maxPipelineRayHitAttributeSize <=
                  (this->props).ray_tracing_pipeline.maxRayHitAttributeSize &&
                 (bVar4 = pnext_chain_is_supported(this,pVVar3->pNext), bVar4)))) &&
               ((info->pLibraryInfo == (VkPipelineLibraryCreateInfoKHR *)0x0 ||
                (bVar4 = pnext_chain_is_supported(this,info->pLibraryInfo->pNext), bVar4)))) {
              if (info->groupCount != 0) {
                lVar7 = 8;
                uVar9 = 0;
                do {
                  bVar4 = pnext_chain_is_supported
                                    (this,*(void **)((long)&info->pGroups->sType + lVar7));
                  if (!bVar4) {
                    return false;
                  }
                  uVar9 = uVar9 + 1;
                  lVar7 = lVar7 + 0x30;
                } while (uVar9 < info->groupCount);
              }
              bVar4 = pnext_chain_is_supported(this,info->pNext);
              return bVar4;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::raytracing_pipeline_is_supported(const VkRayTracingPipelineCreateInfoKHR *info) const
{
	// Only allow flags we recognize and validate.
	constexpr VkPipelineCreateFlags2KHR supported_flags =
			VK_PIPELINE_CREATE_DISABLE_OPTIMIZATION_BIT |
			VK_PIPELINE_CREATE_ALLOW_DERIVATIVES_BIT |
			VK_PIPELINE_CREATE_DERIVATIVE_BIT |
			VK_PIPELINE_CREATE_RAY_TRACING_NO_NULL_ANY_HIT_SHADERS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_NO_NULL_CLOSEST_HIT_SHADERS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_NO_NULL_INTERSECTION_SHADERS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_NO_NULL_MISS_SHADERS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_SKIP_AABBS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_SKIP_TRIANGLES_BIT_KHR |
			VK_PIPELINE_CREATE_LIBRARY_BIT_KHR |
			VK_PIPELINE_CREATE_CAPTURE_INTERNAL_REPRESENTATIONS_BIT_KHR |
			VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR |
			VK_PIPELINE_CREATE_DESCRIPTOR_BUFFER_BIT_EXT |
			VK_PIPELINE_CREATE_RAY_TRACING_ALLOW_MOTION_BIT_NV |
			VK_PIPELINE_CREATE_RAY_TRACING_OPACITY_MICROMAP_BIT_EXT |
			VK_PIPELINE_CREATE_PROTECTED_ACCESS_ONLY_BIT_EXT |
			VK_PIPELINE_CREATE_NO_PROTECTED_ACCESS_BIT_EXT;

	auto flags = get_effective_flags(info);

	if ((flags & ~supported_flags) != 0)
		return false;

	if (null_device)
		return true;

	if ((flags & (VK_PIPELINE_CREATE_RAY_TRACING_SKIP_AABBS_BIT_KHR |
	              VK_PIPELINE_CREATE_RAY_TRACING_SKIP_TRIANGLES_BIT_KHR)) != 0 &&
	    features.ray_tracing_pipeline.rayTraversalPrimitiveCulling == VK_FALSE)
	{
		return false;
	}

	if ((flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0 &&
	    !enabled_extensions.count(VK_KHR_PIPELINE_LIBRARY_EXTENSION_NAME))
	{
		return false;
	}

	if ((flags & VK_PIPELINE_CREATE_DESCRIPTOR_BUFFER_BIT_EXT) != 0)
		if (!features.descriptor_buffer.descriptorBuffer)
			return false;

	if ((flags & VK_PIPELINE_CREATE_RAY_TRACING_ALLOW_MOTION_BIT_NV) != 0 &&
	    features.ray_tracing_motion_blur_nv.rayTracingMotionBlur == VK_FALSE)
		return false;

	if ((flags & VK_PIPELINE_CREATE_RAY_TRACING_OPACITY_MICROMAP_BIT_EXT) != 0 &&
	    features.opacity_micromap.micromap == VK_FALSE)
		return false;

	if ((flags & (VK_PIPELINE_CREATE_PROTECTED_ACCESS_ONLY_BIT_EXT |
	              VK_PIPELINE_CREATE_NO_PROTECTED_ACCESS_BIT_EXT)) != 0 &&
	    features.pipeline_protected_access.pipelineProtectedAccess == VK_FALSE)
		return false;

	if (features.ray_tracing_pipeline.rayTracingPipeline == VK_FALSE)
		return false;

	if (info->maxPipelineRayRecursionDepth > props.ray_tracing_pipeline.maxRayRecursionDepth)
		return false;

	if (info->pDynamicState)
	{
		for (uint32_t i = 0; i < info->pDynamicState->dynamicStateCount; i++)
			if (info->pDynamicState->pDynamicStates[i] != VK_DYNAMIC_STATE_RAY_TRACING_PIPELINE_STACK_SIZE_KHR)
				return false;
		if (!pnext_chain_is_supported(info->pDynamicState->pNext))
			return false;
	}

	if ((info->pLibraryInfo || info->pLibraryInterface) &&
	    !enabled_extensions.count(VK_KHR_PIPELINE_LIBRARY_EXTENSION_NAME))
		return false;

	for (uint32_t i = 0; i < info->stageCount; i++)
	{
		if (!subgroup_size_control_is_supported(info->pStages[i]))
			return false;
		if (!pnext_chain_is_supported(info->pStages[i].pNext))
			return false;
	}

	if (info->pLibraryInterface)
	{
		if (info->pLibraryInterface->maxPipelineRayHitAttributeSize > props.ray_tracing_pipeline.maxRayHitAttributeSize)
			return false;
		if (!pnext_chain_is_supported(info->pLibraryInterface->pNext))
			return false;
	}

	if (info->pLibraryInfo)
	{
		if (!pnext_chain_is_supported(info->pLibraryInfo->pNext))
			return false;
	}

	for (uint32_t i = 0; i < info->groupCount; i++)
	{
		if (!pnext_chain_is_supported(info->pGroups[i].pNext))
			return false;
	}

	return pnext_chain_is_supported(info->pNext);
}